

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astIfNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  sysbvm_tuple_t condition;
  undefined8 *puVar4;
  sysbvm_object_tuple_t *local_68;
  sysbvm_object_tuple_t *psStack_60;
  sysbvm_tuple_t local_58;
  sysbvm_tuple_t sStack_50;
  sysbvm_tuple_t local_48;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *puStack_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_58 = 0;
  sStack_50 = 0;
  local_68 = (sysbvm_object_tuple_t *)0x0;
  psStack_60 = (sysbvm_object_tuple_t *)0x0;
  local_48 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 5;
  puStack_20 = (undefined1 *)&local_68;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_68 = sysbvm_context_allocatePointerTuple
                       (context,(context->roots).functionBytecodeAssemblerLabel,7);
  psStack_60 = sysbvm_context_allocatePointerTuple
                         (context,(context->roots).functionBytecodeAssemblerLabel,7);
  condition = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                        (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                         *(sysbvm_tuple_t *)(*arguments + 0x28));
  sysbvm_functionBytecodeAssembler_jumpIfFalse
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),condition,
             (sysbvm_tuple_t)local_68);
  local_48 = sysbvm_functionBytecodeAssembler_newTemporary
                       (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                        *(sysbvm_tuple_t *)(*arguments + 0x20));
  if (*(sysbvm_tuple_t *)(*arguments + 0x30) == 0) {
    local_58 = sysbvm_functionBytecodeAssembler_addLiteral
                         (context,((sysbvm_functionBytecodeDirectCompiler_t *)arguments[1])->
                                  assembler,0);
  }
  else {
    local_58 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                         (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                          *(sysbvm_tuple_t *)(*arguments + 0x30));
  }
  sysbvm_functionBytecodeAssembler_move
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_48,local_58
            );
  sysbvm_functionBytecodeAssembler_jump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
             (sysbvm_tuple_t)psStack_60);
  lVar1 = *(long *)(arguments[1] + 0x10);
  lVar2 = *(long *)(lVar1 + 0x50);
  local_68[1].header.identityHashAndFlags = (int)lVar2;
  local_68[1].header.objectSize = (int)((ulong)lVar2 >> 0x20);
  puVar4 = (undefined8 *)(lVar2 + 0x28);
  if (lVar2 == 0) {
    puVar4 = (undefined8 *)(lVar1 + 0x48);
  }
  *puVar4 = local_68;
  *(sysbvm_object_tuple_t **)(lVar1 + 0x50) = local_68;
  local_68[2].field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(lVar1 + 0x68);
  uVar3 = *(undefined8 *)(lVar1 + 0x60);
  local_68[2].header.identityHashAndFlags = (int)uVar3;
  local_68[2].header.objectSize = (int)((ulong)uVar3 >> 0x20);
  local_68[2].header.field_0 =
       *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(lVar1 + 0x58);
  if (*(sysbvm_tuple_t *)(*arguments + 0x38) == 0) {
    sStack_50 = sysbvm_functionBytecodeAssembler_addLiteral
                          (context,((sysbvm_functionBytecodeDirectCompiler_t *)arguments[1])->
                                   assembler,0);
  }
  else {
    sStack_50 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                          (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                           *(sysbvm_tuple_t *)(*arguments + 0x38));
  }
  sysbvm_functionBytecodeAssembler_move
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_48,
             sStack_50);
  lVar1 = *(long *)(arguments[1] + 0x10);
  lVar2 = *(long *)(lVar1 + 0x50);
  psStack_60[1].header.identityHashAndFlags = (int)lVar2;
  psStack_60[1].header.objectSize = (int)((ulong)lVar2 >> 0x20);
  puVar4 = (undefined8 *)(lVar2 + 0x28);
  if (lVar2 == 0) {
    puVar4 = (undefined8 *)(lVar1 + 0x48);
  }
  *puVar4 = psStack_60;
  *(sysbvm_object_tuple_t **)(lVar1 + 0x50) = psStack_60;
  psStack_60[2].field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(lVar1 + 0x68);
  uVar3 = *(undefined8 *)(lVar1 + 0x60);
  psStack_60[2].header.identityHashAndFlags = (int)uVar3;
  psStack_60[2].header.objectSize = (int)((ulong)uVar3 >> 0x20);
  psStack_60[2].header.field_0 =
       *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(lVar1 + 0x58);
  return local_48;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIfNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astIfNode_t **ifNode = (sysbvm_astIfNode_t**)node;
    struct {
        sysbvm_tuple_t falseLabel;
        sysbvm_tuple_t mergeLabel;
        sysbvm_tuple_t trueResult;
        sysbvm_tuple_t falseResult;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.falseLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.mergeLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);

    // Emit the condition
    {
        sysbvm_tuple_t condition = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*ifNode)->conditionExpression);
        sysbvm_functionBytecodeAssembler_jumpIfFalse(context, (*compiler)->assembler, condition, gcFrame.falseLabel);
    }

    gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*ifNode)->super.analyzedType);

    // True branch.
    if((*ifNode)->trueExpression)
        gcFrame.trueResult = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*ifNode)->trueExpression);
    else
        gcFrame.trueResult = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_NULL_TUPLE);
    sysbvm_functionBytecodeAssembler_move(context, (*compiler)->assembler, gcFrame.result, gcFrame.trueResult);
    sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.mergeLabel);

    // False branch.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.falseLabel);
    if((*ifNode)->falseExpression)
        gcFrame.falseResult = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*ifNode)->falseExpression);
    else
        gcFrame.falseResult = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_NULL_TUPLE);
    sysbvm_functionBytecodeAssembler_move(context, (*compiler)->assembler, gcFrame.result, gcFrame.falseResult);

    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.mergeLabel);
    return gcFrame.result;
}